

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

mbedtls_ecp_curve_info * mbedtls_ecp_curve_info_from_tls_id(uint16_t tls_id)

{
  mbedtls_ecp_curve_info *pmVar1;
  mbedtls_ecp_curve_info *pmVar2;
  
  pmVar2 = ecp_supported_curves;
  do {
    if (pmVar2->tls_id == tls_id) {
      return pmVar2;
    }
    pmVar1 = pmVar2 + 1;
    pmVar2 = pmVar2 + 1;
  } while (pmVar1->grp_id != MBEDTLS_ECP_DP_NONE);
  return (mbedtls_ecp_curve_info *)0x0;
}

Assistant:

const mbedtls_ecp_curve_info *mbedtls_ecp_curve_info_from_tls_id( uint16_t tls_id )
{
    const mbedtls_ecp_curve_info *curve_info;

    for( curve_info = mbedtls_ecp_curve_list();
         curve_info->grp_id != MBEDTLS_ECP_DP_NONE;
         curve_info++ )
    {
        if( curve_info->tls_id == tls_id )
            return( curve_info );
    }

    return( NULL );
}